

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

stbi_uc * stbi_load_gif_from_memory
                    (stbi_uc *buffer,int len,int **delays,int *x,int *y,int *z,int *comp,
                    int req_comp)

{
  stbi_uc *psVar1;
  int in_ESI;
  stbi_uc *in_RDI;
  stbi__context s;
  uchar *result;
  int *in_stack_00008780;
  int *in_stack_00008788;
  int *in_stack_00008790;
  int *in_stack_00008798;
  int **in_stack_000087a0;
  stbi__context *in_stack_000087a8;
  int in_stack_000087c0;
  stbi__uint32 in_stack_fffffffffffffef0;
  stbi__uint32 in_stack_fffffffffffffef4;
  int in_stack_fffffffffffffef8;
  int in_stack_fffffffffffffefc;
  _func_int_void_ptr_char_ptr_int *in_stack_ffffffffffffff00;
  
  stbi__start_mem((stbi__context *)&stack0xfffffffffffffef0,in_RDI,in_ESI);
  psVar1 = (stbi_uc *)
           stbi__load_gif_main(in_stack_000087a8,in_stack_000087a0,in_stack_00008798,
                               in_stack_00008790,in_stack_00008788,in_stack_00008780,
                               in_stack_000087c0);
  if (stbi__vertically_flip_on_load != 0) {
    stbi__vertical_flip_slices
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,in_stack_fffffffffffffef8,
               in_stack_fffffffffffffef4,in_stack_fffffffffffffef0);
  }
  return psVar1;
}

Assistant:

STBIDEF stbi_uc *stbi_load_gif_from_memory(stbi_uc const *buffer, int len, int **delays, int *x, int *y, int *z, int *comp, int req_comp)
{
   unsigned char *result;
   stbi__context s; 
   stbi__start_mem(&s,buffer,len); 
   
   result = (unsigned char*) stbi__load_gif_main(&s, delays, x, y, z, comp, req_comp);
   if (stbi__vertically_flip_on_load) {
      stbi__vertical_flip_slices( result, *x, *y, *z, *comp ); 
   }

   return result; 
}